

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ebmlmain.c
# Opt level: O1

uint8_t EBML_CodedValueLengthSigned(filepos_t Length,size_t CodedSize,uint8_t *OutBuffer)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  uVar2 = Length + 0x3fU;
  if ((((0x7e < Length + 0x3fU) && (uVar2 = Length + 0x1fffU, 0x3ffe < Length + 0x1fffU)) &&
      (uVar2 = Length + 0xfffffU, 0x1ffffe < Length + 0xfffffU)) &&
     (uVar2 = Length, Length + 0x7ffffffU < 0xfffffff)) {
    uVar2 = Length + 0x7ffffffU;
  }
  *OutBuffer = (uint8_t)(1 << (8 - (uint8_t)CodedSize & 0x1f));
  uVar1 = 0xff;
  if (1 < CodedSize) {
    lVar3 = CodedSize - 1;
    uVar1 = 0xff;
    do {
      OutBuffer[lVar3] = (uint8_t)uVar2;
      uVar2 = (long)uVar2 >> 8;
      uVar1 = uVar1 >> 1;
      lVar3 = lVar3 + -1;
    } while (lVar3 != 0);
  }
  *OutBuffer = *OutBuffer | (byte)uVar1 & (byte)uVar2;
  return (uint8_t)CodedSize;
}

Assistant:

uint8_t EBML_CodedValueLengthSigned(filepos_t Length, size_t CodedSize, uint8_t * OutBuffer)
{
    if (Length > -64 && Length < 64) // 2^6
        Length += 63;
    else if (Length > -8192 && Length < 8192) // 2^13
        Length += 8191;
    else if (Length > -1048576 && Length < 1048576) // 2^20
        Length += 1048575;
    else if (Length > -134217728 && Length < 134217728) // 2^27
        Length += 134217727;

    return EBML_CodedValueLength(Length, CodedSize, OutBuffer, 1);
}